

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_msg_header_trim_u64(nng_msg *msg,uint64_t *val)

{
  int iVar1;
  byte *pbVar2;
  size_t sVar3;
  
  pbVar2 = (byte *)nni_msg_header(msg);
  sVar3 = nni_msg_header_len(msg);
  if (sVar3 < 8) {
    iVar1 = 3;
  }
  else {
    *val = (ulong)pbVar2[7] +
           ((ulong)pbVar2[6] << 8 |
           (ulong)pbVar2[5] << 0x10 |
           (ulong)pbVar2[4] << 0x18 |
           (ulong)pbVar2[3] << 0x20 |
           (ulong)pbVar2[2] << 0x28 | (ulong)pbVar2[1] << 0x30 | (ulong)*pbVar2 << 0x38);
    nni_msg_header_trim(msg,8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_msg_header_trim_u64(nng_msg *msg, uint64_t *val)
{
	uint8_t *header = nni_msg_header(msg);
	uint64_t v;
	if (nng_msg_header_len(msg) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	NNI_GET64(header, v);
	*val = v;
	nni_msg_header_trim(msg, sizeof(v));
	return (0);
}